

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_write_coeffs_txb
               (AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,int blk_row,int blk_col,int plane,
               int block,TX_SIZE tx_size)

{
  int16_t *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  tran_low_t *ptVar6;
  SCAN_ORDER *pSVar7;
  long in_RSI;
  int in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  int dc_sign_ctx;
  int sign;
  tran_low_t level_1;
  tran_low_t v_1;
  int c_1;
  int k;
  int idx;
  aom_cdf_prob *cdf;
  int br_ctx;
  int base_range;
  tran_low_t level;
  tran_low_t v;
  int coeff_ctx;
  int pos;
  int c;
  int bhl;
  int8_t coeff_contexts [4096];
  int16_t *scan;
  SCAN_ORDER *scan_order;
  tran_low_t *tcoeff;
  tran_low_t *tcoeff_txb;
  uint8_t *levels;
  uint8_t levels_buf [1312];
  int height;
  int width;
  int i;
  int bit;
  int eob_shift;
  int eob_ctx;
  int eob_offset_bits;
  int eob_multi_ctx;
  TX_CLASS tx_class;
  int eob_multi_size;
  int eob_pt;
  int eob_extra;
  TX_TYPE tx_type;
  FRAME_CONTEXT *ec_ctx;
  TX_SIZE txs_ctx;
  int txb_skip_ctx;
  uint8_t *entropy_ctx;
  uint16_t eob;
  uint16_t *eob_txb;
  int txb_offset;
  PLANE_TYPE plane_type;
  CB_COEFF_BUFFER *cb_coef_buff;
  MACROBLOCKD *xd;
  int mag;
  int pos_1;
  int stride;
  int row;
  int col;
  int local_16b8;
  uint in_stack_ffffffffffffe94c;
  aom_writer *in_stack_ffffffffffffe950;
  int in_stack_ffffffffffffe95c;
  int in_stack_ffffffffffffe960;
  int in_stack_ffffffffffffe964;
  undefined4 in_stack_ffffffffffffe968;
  TX_SIZE tx_size_00;
  int in_stack_ffffffffffffe96c;
  undefined8 in_stack_ffffffffffffe970;
  undefined4 in_stack_ffffffffffffe978;
  undefined4 in_stack_ffffffffffffe97c;
  undefined8 in_stack_ffffffffffffe980;
  undefined2 uVar8;
  MACROBLOCKD *in_stack_ffffffffffffe988;
  undefined4 in_stack_ffffffffffffe990;
  undefined4 in_stack_ffffffffffffe994;
  undefined4 in_stack_ffffffffffffe998;
  undefined4 in_stack_ffffffffffffe99c;
  undefined4 in_stack_ffffffffffffe9a4;
  undefined4 in_stack_ffffffffffffe9a8;
  undefined4 in_stack_ffffffffffffe9ac;
  int iVar9;
  uint8_t *in_stack_ffffffffffffe9b0;
  uint local_1630;
  uint8_t local_5f8 [1324];
  int local_cc;
  int local_c8;
  int local_c4;
  uint local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  uint local_b0;
  TX_CLASS local_a9;
  int local_a8;
  int local_a4;
  uint local_a0;
  byte local_99;
  long local_98;
  byte local_8d;
  uint local_8c;
  long local_88;
  ushort local_7a;
  long local_78;
  uint local_70;
  byte local_69;
  long local_68;
  long local_60;
  int local_54;
  long local_40;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  TX_CLASS local_19;
  int local_18;
  int local_14;
  uint8_t *local_10;
  int local_4;
  
  uVar8 = (undefined2)((ulong)in_stack_ffffffffffffe980 >> 0x30);
  tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffe968 >> 0x18);
  local_60 = in_RSI + 0x1a0;
  local_68 = *(long *)(in_RSI + 0x4190);
  local_54 = in_R9D;
  local_40 = in_RSI;
  local_69 = get_plane_type(in_R9D);
  local_70 = *(ushort *)(*(long *)(local_40 + 0x4178) + 0x4e + (ulong)local_69 * 2) / 0x10;
  local_78 = *(long *)(local_68 + 0x18 + (long)local_54 * 8) + (long)(int)local_70 * 2;
  local_7a = *(ushort *)(local_78 + (long)in_stack_00000008 * 2);
  local_88 = *(long *)(local_68 + 0x30 + (long)local_54 * 8) + (long)(int)local_70;
  local_8c = *(byte *)(local_88 + in_stack_00000008) & 0xf;
  local_8d = get_txsize_entropy_ctx(in_stack_00000010);
  local_98 = *(long *)(local_60 + 0x2998);
  aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                   in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                   in_stack_ffffffffffffe94c);
  if (local_7a != 0) {
    local_99 = av1_get_tx_type((MACROBLOCKD *)
                               CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978),
                               (PLANE_TYPE)((ulong)in_stack_ffffffffffffe970 >> 0x38),
                               (int)in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c,tx_size_00,
                               in_stack_ffffffffffffe964);
    if (local_54 == 0) {
      av1_write_tx_type((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffe994,in_stack_ffffffffffffe990),
                        in_stack_ffffffffffffe988,(TX_TYPE)((ushort)uVar8 >> 8),(TX_SIZE)uVar8,
                        (aom_writer *)CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978))
      ;
    }
    local_a4 = av1_get_eob_pos_token((uint)local_7a,(int *)&local_a0);
    local_a8 = (int)""[in_stack_00000010];
    local_a9 = ""[local_99];
    local_b0 = (uint)(local_a9 != '\0');
    switch(local_a8) {
    case 0:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      break;
    case 1:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      break;
    case 2:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      break;
    case 3:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      break;
    case 4:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      break;
    case 5:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      break;
    default:
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
    }
    local_b4 = (int)av1_eob_offset_bits[local_a4];
    if (0 < local_b4) {
      local_b8 = local_a4 + -3;
      local_bc = local_b4 + -1;
      local_c0 = (uint)((local_a0 & 1 << ((byte)local_bc & 0x1f)) != 0);
      aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                       in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                       in_stack_ffffffffffffe94c);
      for (local_c4 = 1; local_c4 < local_b4; local_c4 = local_c4 + 1) {
        local_bc = (local_b4 + -1) - local_c4;
        local_c0 = (uint)((local_a0 & 1 << ((byte)local_bc & 0x1f)) != 0);
        aom_write_bit(in_stack_ffffffffffffe950,in_stack_ffffffffffffe94c);
      }
    }
    local_c8 = get_txb_wide('\0');
    local_cc = get_txb_high('\0');
    puVar5 = set_levels(local_5f8,local_cc);
    ptVar6 = (tran_low_t *)
             (*(long *)(local_68 + (long)local_54 * 8) +
              (long)(int)(uint)*(ushort *)
                                (*(long *)(local_40 + 0x4178) + 0x4e + (ulong)local_69 * 2) * 4 +
             (long)(in_stack_00000008 << 4) * 4);
    (*av1_txb_init_levels)(ptVar6,local_c8,local_cc,puVar5);
    pSVar7 = get_scan('\0','\0');
    piVar1 = pSVar7->scan;
    av1_get_nz_map_contexts_sse2
              (in_stack_ffffffffffffe9b0,
               (int16_t *)CONCAT44(in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8),
               (uint16_t)((uint)in_stack_ffffffffffffe9a4 >> 0x10),
               (TX_SIZE)((uint)in_stack_ffffffffffffe9a4 >> 8),(TX_CLASS)in_stack_ffffffffffffe9a4,
               (int8_t *)CONCAT44(in_stack_ffffffffffffe99c,in_stack_ffffffffffffe998));
    iVar2 = get_txb_bhl('\0');
    local_1630 = (uint)local_7a;
LAB_00268ee3:
    local_1630 = local_1630 - 1;
    if (-1 < (int)local_1630) {
      iVar3 = (int)piVar1[(int)local_1630];
      iVar4 = ptVar6[iVar3];
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (local_1630 == local_7a - 1) {
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960)
                         ,in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                         in_stack_ffffffffffffe94c);
      }
      else {
        aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960)
                         ,in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                         in_stack_ffffffffffffe94c);
      }
      if (2 < iVar4) {
        local_19 = local_a9;
        local_18._0_1_ = (byte)iVar2;
        local_20 = iVar3 >> ((byte)local_18 & 0x1f);
        local_24 = iVar3 - (local_20 << ((byte)local_18 & 0x1f));
        local_28 = (1 << ((byte)local_18 & 0x1f)) + 4;
        local_2c = local_20 * local_28 + local_24;
        local_30 = (uint)puVar5[(long)local_2c + 1] + (uint)puVar5[local_2c + local_28];
        if (local_a9 == '\0') {
          if ((uint)((int)((uint)puVar5[local_2c + local_28 + 1] + local_30 + 1) >> 1) < 6) {
            in_stack_ffffffffffffe964 =
                 (int)((uint)puVar5[local_2c + local_28 + 1] + local_30 + 1) >> 1;
          }
          else {
            in_stack_ffffffffffffe964 = 6;
          }
          local_30 = in_stack_ffffffffffffe964;
          local_4 = in_stack_ffffffffffffe964;
          if (iVar3 != 0) {
            if ((1 < local_24) || (1 < local_20)) goto LAB_00269392;
            local_4 = in_stack_ffffffffffffe964 + 7;
          }
        }
        else if (local_a9 == '\x01') {
          if ((uint)((int)((uint)puVar5[local_2c + local_28 * 2] + local_30 + 1) >> 1) < 6) {
            in_stack_ffffffffffffe960 =
                 (int)((uint)puVar5[local_2c + local_28 * 2] + local_30 + 1) >> 1;
          }
          else {
            in_stack_ffffffffffffe960 = 6;
          }
          local_30 = in_stack_ffffffffffffe960;
          local_4 = in_stack_ffffffffffffe960;
          if (iVar3 != 0) {
            if (local_20 != 0) goto LAB_00269392;
            local_4 = in_stack_ffffffffffffe960 + 7;
          }
        }
        else if (local_a9 == '\x02') {
          if ((uint)((int)((uint)puVar5[local_2c + 2] + local_30 + 1) >> 1) < 6) {
            in_stack_ffffffffffffe95c = (int)((uint)puVar5[local_2c + 2] + local_30 + 1) >> 1;
          }
          else {
            in_stack_ffffffffffffe95c = 6;
          }
          local_30 = in_stack_ffffffffffffe95c;
          local_4 = in_stack_ffffffffffffe95c;
          if (iVar3 != 0) {
            if (local_24 != 0) goto LAB_00269392;
            local_4 = in_stack_ffffffffffffe95c + 7;
          }
        }
        else {
LAB_00269392:
          local_4 = local_30 + 0xe;
        }
        in_stack_ffffffffffffe950 = (aom_writer *)(local_98 + 0x1766);
        if (local_8d < 3) {
          in_stack_ffffffffffffe94c = (uint)local_8d;
        }
        else {
          in_stack_ffffffffffffe94c = 3;
        }
        local_18 = iVar2;
        local_14 = iVar3;
        local_10 = puVar5;
        for (iVar9 = 0; iVar9 < 0xc; iVar9 = iVar9 + 3) {
          if ((iVar4 + -3) - iVar9 < 3) {
            local_16b8 = (iVar4 + -3) - iVar9;
          }
          else {
            local_16b8 = 3;
          }
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                           in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                           in_stack_ffffffffffffe94c);
          if (local_16b8 < 3) break;
        }
      }
      goto LAB_00268ee3;
    }
    for (iVar2 = 0; iVar2 < (int)(uint)local_7a; iVar2 = iVar2 + 1) {
      iVar4 = ptVar6[piVar1[iVar2]];
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 != 0) {
        if (iVar2 == 0) {
          aom_write_symbol((aom_writer *)
                           CONCAT44(in_stack_ffffffffffffe964,in_stack_ffffffffffffe960),
                           in_stack_ffffffffffffe95c,(aom_cdf_prob *)in_stack_ffffffffffffe950,
                           in_stack_ffffffffffffe94c);
        }
        else {
          aom_write_bit(in_stack_ffffffffffffe950,in_stack_ffffffffffffe94c);
        }
        if (0xe < iVar4) {
          write_golomb(in_stack_ffffffffffffe950,in_stack_ffffffffffffe94c);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_write_coeffs_txb(const AV1_COMMON *const cm, MACROBLOCK *const x,
                          aom_writer *w, int blk_row, int blk_col, int plane,
                          int block, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                         (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
  const uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
  const uint16_t eob = eob_txb[block];
  const uint8_t *entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
  const int txb_skip_ctx = entropy_ctx[block] & TXB_SKIP_CTX_MASK;
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  aom_write_symbol(w, eob == 0, ec_ctx->txb_skip_cdf[txs_ctx][txb_skip_ctx], 2);
  if (eob == 0) return;

  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  // Only y plane's tx_type is transmitted
  if (plane == 0) {
    av1_write_tx_type(cm, xd, tx_type, tx_size, w);
  }

  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;
  switch (eob_multi_size) {
    case 0:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf16[plane_type][eob_multi_ctx], 5);
      break;
    case 1:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf32[plane_type][eob_multi_ctx], 6);
      break;
    case 2:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf64[plane_type][eob_multi_ctx], 7);
      break;
    case 3:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf128[plane_type][eob_multi_ctx], 8);
      break;
    case 4:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf256[plane_type][eob_multi_ctx], 9);
      break;
    case 5:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf512[plane_type][eob_multi_ctx], 10);
      break;
    default:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf1024[plane_type][eob_multi_ctx], 11);
      break;
  }

  const int eob_offset_bits = av1_eob_offset_bits[eob_pt];
  if (eob_offset_bits > 0) {
    const int eob_ctx = eob_pt - 3;
    int eob_shift = eob_offset_bits - 1;
    int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
    aom_write_symbol(w, bit,
                     ec_ctx->eob_extra_cdf[txs_ctx][plane_type][eob_ctx], 2);
    for (int i = 1; i < eob_offset_bits; i++) {
      eob_shift = eob_offset_bits - 1 - i;
      bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
      aom_write_bit(w, bit);
    }
  }

  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);
  const tran_low_t *tcoeff_txb =
      cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
  const tran_low_t *tcoeff = tcoeff_txb + BLOCK_OFFSET(block);
  av1_txb_init_levels(tcoeff, width, height, levels);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  const int16_t *const scan = scan_order->scan;
  DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
  av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class, coeff_contexts);

  const int bhl = get_txb_bhl(tx_size);
  for (int c = eob - 1; c >= 0; --c) {
    const int pos = scan[c];
    const int coeff_ctx = coeff_contexts[pos];
    const tran_low_t v = tcoeff[pos];
    const tran_low_t level = abs(v);

    if (c == eob - 1) {
      aom_write_symbol(
          w, AOMMIN(level, 3) - 1,
          ec_ctx->coeff_base_eob_cdf[txs_ctx][plane_type][coeff_ctx], 3);
    } else {
      aom_write_symbol(w, AOMMIN(level, 3),
                       ec_ctx->coeff_base_cdf[txs_ctx][plane_type][coeff_ctx],
                       4);
    }
    if (level > NUM_BASE_LEVELS) {
      // level is above 1.
      const int base_range = level - 1 - NUM_BASE_LEVELS;
      const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
      aom_cdf_prob *cdf =
          ec_ctx->coeff_br_cdf[AOMMIN(txs_ctx, TX_32X32)][plane_type][br_ctx];
      for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
        const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
        aom_write_symbol(w, k, cdf, BR_CDF_SIZE);
        if (k < BR_CDF_SIZE - 1) break;
      }
    }
  }

  // Loop to code all signs in the transform block,
  // starting with the sign of DC (if applicable)
  for (int c = 0; c < eob; ++c) {
    const tran_low_t v = tcoeff[scan[c]];
    const tran_low_t level = abs(v);
    const int sign = (v < 0) ? 1 : 0;
    if (level) {
      if (c == 0) {
        const int dc_sign_ctx =
            (entropy_ctx[block] >> DC_SIGN_CTX_SHIFT) & DC_SIGN_CTX_MASK;
        aom_write_symbol(w, sign, ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx],
                         2);
      } else {
        aom_write_bit(w, sign);
      }
      if (level > COEFF_BASE_RANGE + NUM_BASE_LEVELS)
        write_golomb(w, level - COEFF_BASE_RANGE - 1 - NUM_BASE_LEVELS);
    }
  }
}